

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O1

duckdb_decimal * duckdb_get_decimal(duckdb_decimal *__return_storage_ptr__,duckdb_value val)

{
  uint8_t uVar1;
  uint8_t uVar2;
  hugeint_t hVar3;
  
  if (*val == (_duckdb_value)0x15) {
    uVar1 = duckdb::DecimalType::GetWidth((LogicalType *)val);
    uVar2 = duckdb::DecimalType::GetScale((LogicalType *)val);
    hVar3 = duckdb::IntegralValue::Get((Value *)val);
    __return_storage_ptr__->width = uVar1;
    __return_storage_ptr__->scale = uVar2;
    (__return_storage_ptr__->value).lower = hVar3.lower;
    (__return_storage_ptr__->value).upper = hVar3.upper;
  }
  else {
    __return_storage_ptr__->width = '\0';
    __return_storage_ptr__->scale = '\0';
    *(undefined6 *)&__return_storage_ptr__->field_0x2 = 0;
    (__return_storage_ptr__->value).lower = 0;
    (__return_storage_ptr__->value).upper = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

duckdb_decimal duckdb_get_decimal(duckdb_value val) {
	auto &v = UnwrapValue(val);
	auto &type = v.type();
	if (type.id() != LogicalTypeId::DECIMAL) {
		return {0, 0, {0, 0}};
	}
	auto width = duckdb::DecimalType::GetWidth(type);
	auto scale = duckdb::DecimalType::GetScale(type);
	duckdb::hugeint_t hugeint = duckdb::IntegralValue::Get(v);
	return {width, scale, {hugeint.lower, hugeint.upper}};
}